

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  PySequenceMethods *pPVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer paVar4;
  function_record *pfVar5;
  uint __val;
  setter p_Var6;
  uint uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  long *plVar13;
  undefined8 *puVar14;
  type_info *ptVar15;
  detail *pdVar16;
  function_record *pfVar17;
  function_record *pfVar18;
  descrsetfunc p_Var19;
  PyMethodDef *pPVar20;
  object *poVar21;
  PyObject *pPVar22;
  PyObject *pPVar23;
  PyTypeObject *pPVar24;
  ulong *puVar25;
  size_type *psVar26;
  ulong uVar27;
  long *plVar28;
  object *object;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  function_record *pfVar29;
  pointer paVar30;
  char cVar31;
  undefined8 uVar32;
  PySequenceMethods *pPVar33;
  long lVar34;
  uint __len;
  ulong uVar35;
  uint uVar36;
  bool bVar37;
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  undefined1 local_1d0 [16];
  char *local_1c0;
  undefined1 auStack_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  function_record *local_170;
  undefined1 local_168 [39];
  allocator local_141;
  undefined1 local_140 [32];
  PyBufferProcs *local_120;
  type_info **local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  cpp_function *local_f0;
  undefined1 local_e8 [16];
  char *local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  PyGetSetDef local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pcVar11 = "";
  if (rec->name != (char *)0x0) {
    pcVar11 = rec->name;
  }
  local_118 = types;
  local_f0 = this;
  local_b8.doc = (char *)args;
  pcVar11 = strdup(pcVar11);
  rec->name = pcVar11;
  if (rec->doc != (char *)0x0) {
    pcVar12 = strdup(rec->doc);
    rec->doc = pcVar12;
  }
  paVar30 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar4 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_170 = rec;
  if (paVar30 != paVar4) {
    do {
      if (paVar30->name != (char *)0x0) {
        pcVar11 = strdup(paVar30->name);
        paVar30->name = pcVar11;
      }
      if (paVar30->descr == (char *)0x0) {
        pPVar22 = (paVar30->value).m_ptr;
        if (pPVar22 != (PyObject *)0x0) {
          local_d8 = "__repr__";
          local_d0 = (undefined1  [8])0x0;
          local_e8._8_8_ = pPVar22;
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&local_1b0);
          cast<std::__cxx11::string>
                    ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_1d0,(pybind11 *)&local_1b0,object);
          uVar32 = local_1d0._0_8_;
          pcVar11 = strdup((char *)local_1d0._0_8_);
          paVar30->descr = pcVar11;
          if ((PyTypeObject *)uVar32 != (PyTypeObject *)&local_1c0) {
            operator_delete((void *)uVar32,(ulong)((long)local_1c0 + 1));
          }
          pybind11::object::~object((object *)&local_1b0);
          pybind11::object::~object((object *)local_d0);
        }
      }
      else {
        pcVar11 = strdup(paVar30->descr);
        paVar30->descr = pcVar11;
      }
      paVar30 = paVar30 + 1;
    } while (paVar30 != paVar4);
    pcVar11 = local_170->name;
  }
  pfVar29 = local_170;
  iVar9 = strcmp(pcVar11,"__init__");
  if (iVar9 == 0) {
    bVar37 = true;
  }
  else {
    iVar9 = strcmp(pcVar11,"__setstate__");
    bVar37 = iVar9 == 0;
  }
  bVar3 = pfVar29->field_0x59;
  pfVar29->field_0x59 = bVar3 & 0xfe | bVar37;
  if (((bVar3 & 2) == 0 & bVar37) == 1) {
    std::__cxx11::string::string
              ((string *)local_1d0,(char *)(pfVar29->scope).m_ptr[1].ob_type,(allocator *)local_e8);
    std::__cxx11::string::string((string *)local_e8,pfVar29->name,(allocator *)&local_1b0);
    uVar32 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   "pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    plVar13 = (long *)std::__cxx11::string::append(local_110);
    pPVar24 = (PyTypeObject *)(plVar13 + 2);
    if ((PyTypeObject *)*plVar13 == pPVar24) {
      local_168._16_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
      local_168._24_8_ = plVar13[3];
      local_168._0_8_ = (PyObject *)(local_168 + 0x10);
    }
    else {
      local_168._16_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
      local_168._0_8_ = (PyObject *)*plVar13;
    }
    local_168._8_8_ = plVar13[1];
    *plVar13 = (long)pPVar24;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append(local_168,local_e8._0_8_);
    puVar25 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar25) {
      local_190.field_2._M_allocated_capacity = *puVar25;
      local_190.field_2._8_8_ = plVar13[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *puVar25;
      local_190._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_190._M_string_length = plVar13[1];
    *plVar13 = (long)puVar25;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
    psVar26 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar26) {
      local_1b0.field_2._M_allocated_capacity = *psVar26;
      local_1b0.field_2._8_8_ = puVar14[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar26;
      local_1b0._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_1b0._M_string_length = puVar14[1];
    *puVar14 = psVar26;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    PyErr_WarnEx(uVar32,local_1b0._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    pfVar29 = local_170;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      (ulong)(local_190.field_2._M_allocated_capacity + 1));
    }
    if ((PyObject *)local_168._0_8_ != (PyObject *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if ((undefined1 *)local_110._0_8_ != local_100) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    }
    if ((char **)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)((long)local_d8 + 1));
    }
    if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)&local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)((long)local_1c0 + 1));
    }
  }
  local_120 = (PyBufferProcs *)&pfVar29->args;
  local_e8._0_8_ = &local_d8;
  local_e8._8_8_ = (iternextfunc)0x0;
  local_d8 = (char *)((ulong)local_d8 & 0xffffffffffffff00);
  local_b8.set = (setter)&local_1c0;
  pPVar22 = (PyObject *)0x0;
  lVar34 = 0;
  do {
    pPVar23 = (PyObject *)local_b8.doc;
    bVar3 = *text;
    if (bVar3 < 0x7b) {
      if (bVar3 == 0x25) {
        pPVar24 = (PyTypeObject *)local_118[lVar34];
        if (pPVar24 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1d0._0_8_ = pPVar24;
        ptVar15 = detail::get_type_info((type_index *)local_1d0,false);
        pfVar29 = local_170;
        lVar34 = lVar34 + 1;
        if (ptVar15 == (type_info *)0x0) {
          if ((pPVar22 == (PyObject *)0x0 & (byte)local_170->field_0x59 >> 1) != 1) {
            pPVar24 = (pPVar24->ob_base).ob_base.ob_type;
            std::__cxx11::string::string
                      ((string *)local_1d0,
                       (char *)((long)&(pPVar24->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar24->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator *)&local_1b0);
            detail::clean_type_id((string *)local_1d0);
            std::__cxx11::string::_M_append(local_e8,local_1d0._0_8_);
            if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)&local_1c0) {
              operator_delete((void *)local_1d0._0_8_,(ulong)((long)local_1c0 + 1));
            }
            goto LAB_0010c4ee;
          }
          local_110._8_8_ = (local_170->scope).m_ptr;
          local_100._0_8_ = "__module__";
          local_100._8_8_ = (richcmpfunc)0x0;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_110)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle_00);
          local_168._0_8_ = local_168 + 0x10;
          paVar2 = &local_190.field_2;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_168._24_8_ = auStack_1b8;
          }
          else {
            local_168._0_8_ = local_1d0._0_8_;
          }
          local_168._16_8_ = local_1c0;
          local_168._8_8_ = local_1d0._8_8_;
          plVar13 = (long *)std::__cxx11::string::append(local_168);
          puVar25 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_190.field_2._M_allocated_capacity = *puVar25;
            local_190.field_2._8_8_ = plVar13[3];
            local_190._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar25;
            local_190._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_190._M_string_length = plVar13[1];
          *plVar13 = (long)puVar25;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          local_c8._8_8_ = (pfVar29->scope).m_ptr;
          local_b8.name = "__qualname__";
          local_b8.get = (getter)0x0;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle_02);
          local_140._0_8_ = local_1d0._0_8_;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_140._24_8_ = auStack_1b8;
            local_140._0_8_ = (PyTypeObject *)(local_140 + 0x10);
          }
          local_140._16_8_ = local_1c0;
          local_140._8_8_ = local_1d0._8_8_;
          uVar32 = (PySequenceMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar2) {
            uVar32 = local_190.field_2._M_allocated_capacity;
          }
          pPVar1 = (PySequenceMethods *)
                   ((long)(binaryfunc *)local_1d0._8_8_ + local_190._M_string_length);
          if ((ulong)uVar32 < pPVar1) {
            pPVar33 = (PySequenceMethods *)0xf;
            if ((PyTypeObject *)local_140._0_8_ != (PyTypeObject *)(local_140 + 0x10)) {
              pPVar33 = (PySequenceMethods *)local_1c0;
            }
            if (pPVar33 < pPVar1) goto LAB_0010c2fa;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_140,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
          }
          else {
LAB_0010c2fa:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_190,local_140._0_8_);
          }
          psVar26 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar26) {
            local_1b0.field_2._M_allocated_capacity = *psVar26;
            local_1b0.field_2._8_8_ = puVar14[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar26;
            local_1b0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_1b0._M_string_length = puVar14[1];
          *puVar14 = psVar26;
          puVar14[1] = 0;
          *(undefined1 *)psVar26 = 0;
          std::__cxx11::string::_M_append(local_e8,(ulong)local_1b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_140._0_8_ != (PyTypeObject *)(local_140 + 0x10)) {
            operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
          }
          pybind11::object::~object((object *)&local_b8.get);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar2) {
            operator_delete(local_190._M_dataplus._M_p,
                            (ulong)(local_190.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          pybind11::object::~object((object *)(local_100 + 8));
          pPVar22 = (PyObject *)0x0;
        }
        else {
          pPVar24 = ptVar15->type;
          local_100._0_8_ = "__module__";
          local_100._8_8_ = (richcmpfunc)0x0;
          local_110._8_8_ = pPVar24;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_110)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle);
          local_168._0_8_ = local_168 + 0x10;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_168._24_8_ = auStack_1b8;
          }
          else {
            local_168._0_8_ = local_1d0._0_8_;
          }
          local_168._16_8_ = local_1c0;
          local_168._8_8_ = local_1d0._8_8_;
          plVar13 = (long *)std::__cxx11::string::append(local_168);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar25 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_190.field_2._M_allocated_capacity = *puVar25;
            local_190.field_2._8_8_ = plVar13[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar25;
            local_190._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_190._M_string_length = plVar13[1];
          *plVar13 = (long)puVar25;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          local_b8.name = "__qualname__";
          local_b8.get = (getter)0x0;
          local_c8._8_8_ = pPVar24;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle_01);
          pPVar24 = (PyTypeObject *)(local_140 + 0x10);
          local_140._0_8_ = local_1d0._0_8_;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_140._24_8_ = auStack_1b8;
            local_140._0_8_ = pPVar24;
          }
          local_140._16_8_ = local_1c0;
          local_140._8_8_ = local_1d0._8_8_;
          uVar32 = (PySequenceMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            uVar32 = local_190.field_2._M_allocated_capacity;
          }
          pPVar1 = (PySequenceMethods *)
                   ((long)(binaryfunc *)local_1d0._8_8_ + local_190._M_string_length);
          if ((ulong)uVar32 < pPVar1) {
            pPVar33 = (PySequenceMethods *)0xf;
            if ((PyTypeObject *)local_140._0_8_ != pPVar24) {
              pPVar33 = (PySequenceMethods *)local_1c0;
            }
            if (pPVar33 < pPVar1) goto LAB_0010c066;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_140,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
          }
          else {
LAB_0010c066:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_190,local_140._0_8_);
          }
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          psVar26 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar26) {
            local_1b0.field_2._M_allocated_capacity = *psVar26;
            local_1b0.field_2._8_8_ = puVar14[3];
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar26;
            local_1b0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_1b0._M_string_length = puVar14[1];
          *puVar14 = psVar26;
          puVar14[1] = 0;
          *(undefined1 *)psVar26 = 0;
          std::__cxx11::string::_M_append(local_e8,(ulong)local_1b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_140._0_8_ != pPVar24) {
            operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
          }
          pybind11::object::~object((object *)&local_b8.get);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            (ulong)(local_190.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          pybind11::object::~object((object *)(local_100 + 8));
        }
      }
      else {
        if (bVar3 == 0) break;
LAB_0010be83:
        std::__cxx11::string::push_back((char)local_e8);
      }
    }
    else if (bVar3 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        paVar30 = (local_170->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((pPVar22 < (PyObject *)
                        ((long)(local_170->args).
                               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5)) &&
            (paVar30[(long)pPVar22].name != (char *)0x0)) ||
           ((local_170->field_0x59 & 0x40) != 0 && pPVar22 == (PyObject *)0x0)) {
          std::__cxx11::string::append(local_e8);
        }
        else {
          uVar35 = (long)pPVar22 - (ulong)(((byte)local_170->field_0x59 >> 6 & 1) != 0);
          cVar31 = '\x01';
          if (9 < uVar35) {
            uVar27 = uVar35;
            cVar8 = '\x04';
            do {
              cVar31 = cVar8;
              if (uVar27 < 100) {
                cVar31 = cVar31 + -2;
                goto LAB_0010c40a;
              }
              if (uVar27 < 1000) {
                cVar31 = cVar31 + -1;
                goto LAB_0010c40a;
              }
              if (uVar27 < 10000) goto LAB_0010c40a;
              bVar37 = 99999 < uVar27;
              uVar27 = uVar27 / 10000;
              cVar8 = cVar31 + '\x04';
            } while (bVar37);
            cVar31 = cVar31 + '\x01';
          }
LAB_0010c40a:
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar31);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1b0._M_dataplus._M_p,(uint)local_1b0._M_string_length,uVar35);
          plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x117ab5);
          local_1d0._0_8_ = &local_1c0;
          pPVar24 = (PyTypeObject *)(plVar13 + 2);
          if ((PyTypeObject *)*plVar13 == pPVar24) {
            local_1c0 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            auStack_1b8 = (undefined1  [8])plVar13[3];
          }
          else {
            local_1c0 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            local_1d0._0_8_ = (PyTypeObject *)*plVar13;
          }
          local_1d0._8_8_ = plVar13[1];
          *plVar13 = (long)pPVar24;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::_M_append(local_e8,local_1d0._0_8_);
          if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)&local_1c0) {
            operator_delete((void *)local_1d0._0_8_,(ulong)((long)local_1c0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append(local_e8);
      }
    }
    else {
      if (bVar3 != 0x7d) goto LAB_0010be83;
      paVar30 = (local_170->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pPVar22 < (PyObject *)
                     ((long)(local_170->args).
                            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5)) &&
         (paVar30[(long)pPVar22].descr != (char *)0x0)) {
        std::__cxx11::string::append(local_e8);
        std::__cxx11::string::append(local_e8);
      }
      pPVar22 = (PyObject *)((long)&pPVar22->ob_refcnt + 1);
    }
LAB_0010c4ee:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((pPVar22 != (PyObject *)local_b8.doc) || (local_118[lVar34] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar11 = strdup((char *)local_e8._0_8_);
  pfVar29 = local_170;
  local_170->signature = pcVar11;
  if ((local_170->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_170->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)local_120);
  }
  pfVar29->nargs = (uint16_t)pPVar23;
  pPVar22 = (pfVar29->sibling).m_ptr;
  if (pPVar22 == (PyObject *)0x0) {
LAB_0010c69e:
    pPVar20 = (PyMethodDef *)operator_new(0x20);
    pfVar29->def = pPVar20;
    *(undefined8 *)&pPVar20->ml_flags = 0;
    pPVar20->ml_doc = (char *)0x0;
    pPVar20->ml_name = pfVar29->name;
    pPVar20->ml_meth = dispatcher;
    pPVar20->ml_flags = 3;
    capsule::capsule((capsule *)&local_1b0,pfVar29,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    local_190._M_dataplus._M_p = (pointer)0x0;
    pPVar22 = (pfVar29->scope).m_ptr;
    if (pPVar22 != (PyObject *)0x0) {
      iVar9 = PyObject_HasAttrString(pPVar22,"__module__");
      if (iVar9 == 1) {
        local_1d0._8_8_ = (pfVar29->scope).m_ptr;
        local_1c0 = "__module__";
        auStack_1b8 = (undefined1  [8])0x0;
        poVar21 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1d0);
      }
      else {
        iVar9 = PyObject_HasAttrString((pfVar29->scope).m_ptr,"__name__");
        if (iVar9 != 1) goto LAB_0010c79a;
        local_1d0._8_8_ = (pfVar29->scope).m_ptr;
        local_1c0 = "__name__";
        auStack_1b8 = (undefined1  [8])0x0;
        poVar21 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1d0);
      }
      local_168._0_8_ = (poVar21->super_handle).m_ptr;
      if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)0x0) {
        (((PyVarObject *)&((PyObject *)local_168._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
             (((PyVarObject *)&((PyObject *)local_168._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
      }
      pybind11::object::operator=((object *)&local_190,(object *)local_168);
      pybind11::object::~object((object *)local_168);
      pybind11::object::~object((object *)auStack_1b8);
    }
LAB_0010c79a:
    pPVar22 = (PyObject *)
              PyCMethod_New(pfVar29->def,local_1b0._M_dataplus._M_p,local_190._M_dataplus._M_p,0);
    (local_f0->super_function).super_object.super_handle.m_ptr = pPVar22;
    if (pPVar22 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    pybind11::object::~object((object *)&local_190);
    pybind11::object::~object((object *)&local_1b0);
    p_Var19 = (descrsetfunc)&local_1c0;
    local_1d0._8_8_ = (PyObject *)0x0;
    local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
    uVar35 = CONCAT71((int7)((ulong)pPVar23 >> 8),1);
    pfVar17 = pfVar29;
    local_1d0._0_8_ = p_Var19;
    local_b8.set = (setter)p_Var19;
  }
  else {
    if (pPVar22->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar22 = (PyObject *)pPVar22[1].ob_refcnt;
      (pfVar29->sibling).m_ptr = pPVar22;
      if (pPVar22 == (PyObject *)0x0) goto LAB_0010c69e;
    }
    if (pPVar22->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar9 = PyType_IsSubtype(pPVar22->ob_type,&PyCFunction_Type);
      pPVar22 = (pfVar29->sibling).m_ptr;
      if (iVar9 == 0) {
        if ((pPVar22 != (PyObject *)&_Py_NoneStruct) && (*pfVar29->name != '_')) {
          std::__cxx11::string::string((string *)&local_190,pfVar29->name,(allocator *)local_168);
          std::operator+(&local_1b0,"Cannot overload existing non-function object \"",&local_190);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          local_1d0._0_8_ = *plVar13;
          psVar26 = (size_type *)(plVar13 + 2);
          if ((size_type *)local_1d0._0_8_ == psVar26) {
            local_1c0 = (char *)*psVar26;
            auStack_1b8 = (undefined1  [8])plVar13[3];
            local_1d0._0_8_ = &local_1c0;
          }
          else {
            local_1c0 = (char *)*psVar26;
          }
          local_1d0._8_8_ = plVar13[1];
          *plVar13 = (long)psVar26;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          pybind11_fail((string *)local_1d0);
        }
        goto LAB_0010c69e;
      }
    }
    if ((*(byte *)(pPVar22[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1d0._0_8_ = pPVar22[1].ob_type;
      if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_1d0._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_1d0._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
    }
    else {
      local_1d0._0_8_ = (PyTypeObject *)0x0;
    }
    pfVar17 = capsule::operator_cast_to_function_record_((capsule *)local_1d0);
    pPVar23 = (pfVar17->scope).m_ptr;
    pPVar22 = (pfVar29->scope).m_ptr;
    pybind11::object::~object((object *)local_1d0);
    if (pPVar23 != pPVar22) goto LAB_0010c69e;
    pPVar22 = (pfVar29->sibling).m_ptr;
    (local_f0->super_function).super_object.super_handle.m_ptr = pPVar22;
    if (pPVar22 != (PyObject *)0x0) {
      pPVar22->ob_refcnt = pPVar22->ob_refcnt + 1;
    }
    bVar3 = pfVar29->field_0x59;
    pfVar5 = pfVar17;
    if (((pfVar17->field_0x59 ^ bVar3) & 0x40) != 0) {
      pcVar11 = "instance";
      if ((bVar3 & 0x40) == 0) {
        pcVar11 = "static";
      }
      local_c8._0_8_ = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,pcVar11,pcVar11 + (ulong)((bVar3 & 0x40) >> 6) * 2 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8)
      ;
      plVar13 = (long *)std::__cxx11::string::append(local_140);
      local_110._0_8_ = *plVar13;
      plVar28 = plVar13 + 2;
      if ((long *)local_110._0_8_ == plVar28) {
        local_100._0_8_ = *plVar28;
        local_100._8_8_ = plVar13[3];
        local_110._0_8_ = local_100;
      }
      else {
        local_100._0_8_ = *plVar28;
      }
      local_110._8_8_ = plVar13[1];
      *plVar13 = (long)plVar28;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_50.obj.m_ptr = (local_170->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>((str *)&local_b8.closure,&local_50);
      str::operator_cast_to_string(&local_70,(str *)&local_b8.closure);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_70);
      plVar13 = (long *)std::__cxx11::string::append(local_168);
      local_190._M_dataplus._M_p = (pointer)*plVar13;
      plVar28 = plVar13 + 2;
      if ((long *)local_190._M_dataplus._M_p == plVar28) {
        local_190.field_2._M_allocated_capacity = *plVar28;
        local_190.field_2._8_8_ = plVar13[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *plVar28;
      }
      local_190._M_string_length = plVar13[1];
      *plVar13 = (long)plVar28;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::string((string *)&local_90,local_170->name,&local_141);
      std::operator+(&local_1b0,&local_190,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     &local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
      pybind11_fail((string *)local_1d0);
    }
    do {
      pfVar18 = pfVar5;
      pfVar5 = pfVar18->next;
    } while (pfVar5 != (function_record *)0x0);
    pfVar18->next = pfVar29;
    p_Var19 = (descrsetfunc)&local_1c0;
    local_1d0._8_8_ = (PyObject *)0x0;
    local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
    local_1d0._0_8_ = p_Var19;
    if (DAT_0011f641 == 1) {
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::append(local_1d0);
      p_Var19 = (descrsetfunc)std::__cxx11::string::append(local_1d0);
    }
    if (pfVar17 == (function_record *)0x0) goto LAB_0010ca4d;
    uVar35 = 0;
  }
  iVar9 = 0;
  local_120 = (PyBufferProcs *)
              CONCAT44(local_120._4_4_,(int)CONCAT71((int7)((ulong)p_Var19 >> 8),1));
  local_b8.doc = (char *)CONCAT44(local_b8.doc._4_4_,(int)uVar35);
  do {
    if (DAT_0011f641 == 1) {
      if (0 < iVar9) {
        std::__cxx11::string::append(local_1d0);
      }
      if ((char)uVar35 == '\0') {
        uVar36 = iVar9 + 1;
        local_118 = (type_info **)CONCAT44(local_118._4_4_,uVar36);
        __val = -uVar36;
        if (0 < (int)uVar36) {
          __val = uVar36;
        }
        __len = 1;
        if (9 < __val) {
          uVar35 = (ulong)__val;
          uVar7 = 4;
          do {
            __len = uVar7;
            uVar10 = (uint)uVar35;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0010c8a1;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0010c8a1;
            }
            if (uVar10 < 10000) goto LAB_0010c8a1;
            uVar35 = uVar35 / 10000;
            uVar7 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0010c8a1:
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_190,(char)__len - (char)((int)uVar36 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_190._M_dataplus._M_p + (uVar36 >> 0x1f),__len,__val);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
        pfVar29 = local_170;
        psVar26 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar26) {
          local_1b0.field_2._M_allocated_capacity = *psVar26;
          local_1b0.field_2._8_8_ = puVar14[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar26;
          local_1b0._M_dataplus._M_p = (pointer)*puVar14;
        }
        iVar9 = (int)local_118;
        local_1b0._M_string_length = puVar14[1];
        *puVar14 = psVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append(local_1d0,(ulong)local_1b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        uVar35 = (ulong)local_b8.doc & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          (ulong)(local_190.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::append(local_1d0);
    }
    if (((pfVar17->doc != (char *)0x0) && (*pfVar17->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (((DAT_0011f641 | (byte)local_120) & 1) == 0) {
        std::__cxx11::string::append(local_1d0);
        local_120 = (PyBufferProcs *)((ulong)local_120 & 0xffffffff00000000);
      }
      else {
        local_120 = (PyBufferProcs *)
                    CONCAT44(local_120._4_4_,
                             CONCAT31((int3)((ulong)local_120 >> 8),(byte)local_120 & DAT_0011f641))
        ;
      }
      if ((DAT_0011f641 & 1) != 0) {
        std::__cxx11::string::append(local_1d0);
      }
      std::__cxx11::string::append(local_1d0);
      if (DAT_0011f641 == 1) {
        std::__cxx11::string::append(local_1d0);
      }
    }
    pfVar17 = pfVar17->next;
  } while (pfVar17 != (function_record *)0x0);
LAB_0010ca4d:
  pPVar22 = (local_f0->super_function).super_object.super_handle.m_ptr;
  lVar34 = pPVar22[1].ob_refcnt;
  if (*(void **)(lVar34 + 0x18) != (void *)0x0) {
    free(*(void **)(lVar34 + 0x18));
    lVar34 = pPVar22[1].ob_refcnt;
  }
  pcVar11 = strdup((char *)local_1d0._0_8_);
  p_Var6 = local_b8.set;
  *(char **)(lVar34 + 0x18) = pcVar11;
  if ((pfVar29->field_0x59 & 0x40) != 0) {
    pPVar23 = (PyObject *)
              PyInstanceMethod_New((local_f0->super_function).super_object.super_handle.m_ptr);
    (local_f0->super_function).super_object.super_handle.m_ptr = pPVar23;
    if (pPVar23 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar22->ob_refcnt = pPVar22->ob_refcnt + -1;
    if (pPVar22->ob_refcnt == 0) {
      _Py_Dealloc(pPVar22);
    }
  }
  if ((setter)local_1d0._0_8_ != p_Var6) {
    operator_delete((void *)local_1d0._0_8_,(long)local_1c0 + 1);
  }
  if ((char **)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_,(ulong)((long)local_d8 + 1));
  }
  return;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = std::string(((PyTypeObject *) rec->scope.ptr())->tp_name);
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;

                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }